

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerNewScFunc(Lowerer *this,Instr *newScFuncInstr)

{
  RegOpnd *envOpnd_00;
  Opnd *pOVar1;
  Instr *pIVar2;
  IntConstOpnd *functionBodySlotOpnd;
  Instr *pIVar3;
  RegOpnd *local_30;
  RegOpnd *envOpnd;
  
  pOVar1 = IR::Instr::UnlinkSrc2(newScFuncInstr);
  local_30 = IR::Opnd::AsRegOpnd(pOVar1);
  if (newScFuncInstr->m_func->stackNestedFunc == true) {
    pIVar2 = GenerateNewStackScFunc(this,newScFuncInstr,&local_30);
  }
  else {
    pIVar2 = (Instr *)0x0;
  }
  envOpnd_00 = local_30;
  pOVar1 = IR::Instr::UnlinkSrc1(newScFuncInstr);
  functionBodySlotOpnd = IR::Opnd::AsIntConstOpnd(pOVar1);
  pIVar3 = LoadFunctionBodyAsArgument(this,newScFuncInstr,functionBodySlotOpnd,envOpnd_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,newScFuncInstr,HelperScrFunc_OP_NewScFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  if (pIVar2 != (Instr *)0x0) {
    pIVar3 = pIVar2;
  }
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScFunc(IR::Instr * newScFuncInstr)
{
    IR::Instr *stackNewScFuncInstr = nullptr;
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    if (newScFuncInstr->m_func->DoStackNestedFunc())
    {
        stackNewScFuncInstr = GenerateNewStackScFunc(newScFuncInstr, &envOpnd);
    }

    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScFunc );

    return stackNewScFuncInstr == nullptr? instrPrev : stackNewScFuncInstr;
}